

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O2

int Abc_TtMinBase(word *pTruth,int *pVars,int nVars,int nVarsAll)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  word wVar4;
  byte bVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  byte bVar11;
  byte bVar12;
  word (*pawVar13) [3];
  word *pwVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  uint uVar19;
  word *pwVar20;
  word *pwVar21;
  ulong uVar22;
  word *pwVar23;
  word *pwVar24;
  ulong uVar25;
  
  if (nVarsAll < nVars) {
    __assert_fail("nVars <= nVarsAll",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                  ,0x75b,"int Abc_TtMinBase(word *, int *, int, int)");
  }
  uVar6 = 1 << ((char)nVarsAll - 6U & 0x1f);
  uVar25 = 0;
  uVar9 = (ulong)uVar6;
  if ((int)uVar6 < 1) {
    uVar9 = uVar25;
  }
  uVar10 = 0;
  if (0 < nVars) {
    uVar10 = (ulong)(uint)nVars;
  }
  uVar8 = 0;
  for (; uVar25 != uVar10; uVar25 = uVar25 + 1) {
    iVar7 = Abc_TtHasVar(pTruth,nVarsAll,(int)uVar25);
    if (iVar7 != 0) {
      lVar16 = (long)(int)uVar8;
      if (lVar16 < (long)uVar25) {
        if (pVars != (int *)0x0) {
          pVars[lVar16] = pVars[uVar25];
        }
        if (uVar25 != uVar8) {
          bVar12 = (byte)uVar25;
          bVar11 = (byte)uVar8;
          if (nVarsAll < 7) {
            uVar17 = *pTruth;
            bVar12 = (char)(-1 << (bVar11 & 0x1f)) + (char)(1 << (bVar12 & 0x1f));
            *pTruth = (uVar17 & s_PPMasks[lVar16][uVar25][2]) >> (bVar12 & 0x3f) |
                      (s_PPMasks[lVar16][uVar25][1] & uVar17) << (bVar12 & 0x3f) |
                      s_PPMasks[lVar16][uVar25][0] & uVar17;
          }
          else if (uVar25 < 6) {
            pawVar13 = s_PPMasks[lVar16] + uVar25;
            bVar12 = (char)(-1 << (bVar11 & 0x1f)) + (char)(1 << (bVar12 & 0x1f));
            for (uVar17 = 0; uVar9 != uVar17; uVar17 = uVar17 + 1) {
              uVar22 = pTruth[uVar17];
              pTruth[uVar17] =
                   (uVar22 & (*pawVar13)[2]) >> (bVar12 & 0x3f) |
                   ((*pawVar13)[1] & uVar22) << (bVar12 & 0x3f) | (*pawVar13)[0] & uVar22;
            }
          }
          else if ((int)uVar8 < 6) {
            uVar19 = 1 << (bVar12 - 6 & 0x1f);
            iVar7 = 2 << (bVar12 - 6 & 0x1f);
            uVar17 = 0;
            if (0 < (int)uVar19) {
              uVar17 = (ulong)uVar19;
            }
            pwVar14 = pTruth + (int)uVar19;
            for (pwVar21 = pTruth; pwVar21 < pTruth + (int)uVar6; pwVar21 = pwVar21 + iVar7) {
              for (uVar22 = 0; uVar17 != uVar22; uVar22 = uVar22 + 1) {
                uVar1 = pwVar21[uVar22];
                uVar2 = s_Truths6[lVar16];
                bVar12 = (byte)(1 << (bVar11 & 0x1f));
                uVar3 = pwVar14[uVar22];
                pwVar21[uVar22] = (uVar3 << (bVar12 & 0x3f) ^ uVar1) & uVar2 ^ uVar1;
                pwVar14[uVar22] = uVar3 & uVar2 | (uVar2 & uVar1) >> (bVar12 & 0x3f);
              }
              pwVar14 = pwVar14 + iVar7;
            }
          }
          else {
            bVar5 = bVar11 - 6 & 0x1f;
            uVar19 = 1 << bVar5;
            iVar7 = 2 << (bVar12 - 6 & 0x1f);
            uVar17 = 0;
            if (0 < 1 << bVar5) {
              uVar17 = (ulong)uVar19;
            }
            lVar16 = (long)(2 << (bVar11 - 6 & 0x1f));
            lVar18 = (long)(1 << (bVar12 - 6 & 0x1f));
            pwVar14 = pTruth + lVar18;
            pwVar21 = pTruth + (int)uVar19;
            for (pwVar24 = pTruth; pwVar24 < pTruth + (int)uVar6; pwVar24 = pwVar24 + iVar7) {
              pwVar20 = pwVar14;
              pwVar23 = pwVar21;
              for (lVar15 = 0; lVar15 < lVar18; lVar15 = lVar15 + lVar16) {
                for (uVar22 = 0; uVar17 != uVar22; uVar22 = uVar22 + 1) {
                  wVar4 = pwVar23[uVar22];
                  pwVar23[uVar22] = pwVar20[uVar22];
                  pwVar20[uVar22] = wVar4;
                }
                pwVar20 = pwVar20 + lVar16;
                pwVar23 = pwVar23 + lVar16;
              }
              pwVar14 = pwVar14 + iVar7;
              pwVar21 = pwVar21 + iVar7;
            }
          }
        }
      }
      uVar8 = uVar8 + 1;
    }
  }
  if ((int)uVar8 <= nVars) {
    return uVar8;
  }
  __assert_fail("k < nVars",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                ,0x769,"int Abc_TtMinBase(word *, int *, int, int)");
}

Assistant:

static inline int Abc_TtMinBase( word * pTruth, int * pVars, int nVars, int nVarsAll ) 
{
    int i, k;
    assert( nVars <= nVarsAll );
    for ( i = k = 0; i < nVars; i++ )
    {
        if ( !Abc_TtHasVar( pTruth, nVarsAll, i ) )
            continue;
        if ( k < i )
        {
            if ( pVars ) pVars[k] = pVars[i];
            Abc_TtSwapVars( pTruth, nVarsAll, k, i );
        }
        k++;
    }
    if ( k == nVars )
        return k;
    assert( k < nVars );
//    assert( k == Abc_TtSupportSize(pTruth, nVars) );
    return k;
}